

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall fmp4_stream::media_fragment::print(media_fragment *this)

{
  ulong uVar1;
  pointer peVar2;
  ulong uVar3;
  long lVar4;
  
  peVar2 = (this->emsg_).super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->emsg_).super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
      _M_impl.super__Vector_impl_data._M_finish != peVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      if ((*(long *)((long)&((string *)(&peVar2->super_full_box + 1))->_M_string_length + lVar4) !=
           0) && (this->e_msg_is_in_mdat_ == false)) {
        (**(code **)(*(long *)((peVar2->super_full_box).super_box.extended_type_ + lVar4 + -0x38) +
                    8))();
      }
      uVar3 = uVar3 + 1;
      peVar2 = (this->emsg_).
               super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = ((long)(this->emsg_).
                     super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)peVar2 >> 5) *
              0x6db6db6db6db6db7;
      lVar4 = lVar4 + 0xe0;
    } while (uVar3 <= uVar1 && uVar1 - uVar3 != 0);
  }
  box::print(&this->moof_box_);
  mfhd::print(&this->mfhd_);
  tfhd::print(&this->tfhd_);
  tfdt::print(&this->tfdt_);
  trun::print(&this->trun_);
  box::print(&this->mdat_box_);
  peVar2 = (this->emsg_).super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->emsg_).super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
      _M_impl.super__Vector_impl_data._M_finish != peVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      if ((*(long *)((long)&((string *)(&peVar2->super_full_box + 1))->_M_string_length + lVar4) !=
           0) && (this->e_msg_is_in_mdat_ == true)) {
        (**(code **)(*(long *)((peVar2->super_full_box).super_box.extended_type_ + lVar4 + -0x38) +
                    8))();
      }
      uVar3 = uVar3 + 1;
      peVar2 = (this->emsg_).
               super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = ((long)(this->emsg_).
                     super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)peVar2 >> 5) *
              0x6db6db6db6db6db7;
      lVar4 = lVar4 + 0xe0;
    } while (uVar3 <= uVar1 && uVar1 - uVar3 != 0);
  }
  return;
}

Assistant:

void media_fragment::print() const
	{
		for(int i=0;i<emsg_.size();i++)
		    if (emsg_[i].scheme_id_uri_.size() && !this->e_msg_is_in_mdat_)
			   emsg_[i].print();

		moof_box_.print(); // moof box size
		mfhd_.print(); // moof box header
		tfhd_.print(); // track fragment header
		tfdt_.print(); // track fragment decode time
		trun_.print(); // trun box
		mdat_box_.print(); // mdat 

		for (int i = 0; i<emsg_.size(); i++)
		    if (emsg_[i].scheme_id_uri_.size() && this->e_msg_is_in_mdat_)
			    emsg_[i].print();
	}